

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setSystemNoiseVariance
          (AttitudeQuaternionEKF *this,double gyro,double gyro_bias)

{
  byte bVar1;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  bool ok;
  Span<double,__1L> Q_span;
  MatrixDynSize Q;
  MatrixDynSize *in_stack_00000328;
  AttitudeQuaternionEKF *in_stack_00000330;
  pointer in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  Span<double,__1L> *in_stack_ffffffffffffffb0;
  DiscreteExtendedKalmanFilterHelper *in_stack_ffffffffffffffb8;
  MatrixDynSize local_40 [64];
  
  *(undefined8 *)(in_RDI + 0x2b0) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x2b8) = in_XMM1_Qa;
  iDynTree::MatrixDynSize::MatrixDynSize
            (local_40,*(ulong *)(in_RDI + 0x3d8),*(ulong *)(in_RDI + 0x3d8));
  prepareSystemNoiseCovarianceMatrix(in_stack_00000330,in_stack_00000328);
  iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::capacity();
  Span<double,_-1L>::Span
            ((Span<double,__1L> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             in_stack_ffffffffffffff68,0x6213b0);
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetSystemNoiseCovariance
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setSystemNoiseVariance(double gyro, double gyro_bias)
{
    m_params_qekf.gyroscope_noise_variance = gyro;
    m_params_qekf.gyro_bias_noise_variance = gyro_bias;

    iDynTree::MatrixDynSize Q = iDynTree::MatrixDynSize(m_state_size, m_state_size);
    prepareSystemNoiseCovarianceMatrix(Q);
    iDynTree::Span<double> Q_span(Q.data(), Q.capacity());
    bool ok = ekfSetSystemNoiseCovariance(Q_span);
    return ok;
}